

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

DynamicHistogram<double> * __thiscall
StatisticsTracker::getHistogram
          (DynamicHistogram<double> *__return_storage_ptr__,StatisticsTracker *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  undefined3 uVar5;
  int iVar6;
  
  __return_storage_ptr__->_vptr_DynamicHistogram = (_func_int **)&PTR__DynamicHistogram_00288828;
  uVar4 = *(undefined4 *)&(this->_histogram).field_0xc;
  dVar1 = (this->_histogram)._binMax;
  dVar2 = (this->_histogram)._binMin;
  dVar3 = (this->_histogram)._binWidth;
  __return_storage_ptr__->_binCount = (this->_histogram)._binCount;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar4;
  __return_storage_ptr__->_binMax = dVar1;
  __return_storage_ptr__->_binMin = dVar2;
  __return_storage_ptr__->_binWidth = dVar3;
  (__return_storage_ptr__->_cache)._count = (this->_histogram)._cache._count;
  std::vector<double,_std::allocator<double>_>::vector
            (&(__return_storage_ptr__->_cache)._data,&(this->_histogram)._cache._data);
  __return_storage_ptr__->_enabled = (this->_histogram)._enabled;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->_frequencies,&(this->_histogram)._frequencies);
  uVar5 = *(undefined3 *)&(this->_histogram).field_0x69;
  iVar6 = (this->_histogram)._numMerges;
  __return_storage_ptr__->_initialized = (this->_histogram)._initialized;
  *(undefined3 *)&__return_storage_ptr__->field_0x69 = uVar5;
  __return_storage_ptr__->_numMerges = iVar6;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->_temp,&(this->_histogram)._temp);
  return __return_storage_ptr__;
}

Assistant:

DynamicHistogram<double>
    getHistogram(void) const
    {
        return this->_histogram;
    }